

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrOffset2Df *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  string y_prefix;
  string x_prefix;
  ostringstream oss_y;
  ostringstream oss_x;
  _Alloc_hider in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [11];
  
  PointerToHexString<XrOffset2Df>((XrOffset2Df *)in_stack_fffffffffffffc88._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&local_358,(string *)prefix);
  std::__cxx11::string::append((char *)&local_358);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(undefined8 *)
   ((long)&local_1a0[0]._M_string_length + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18)) = 0x20;
  std::ostream::operator<<((ostream *)local_1a0,value->x);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",&local_358,local_318);
  std::__cxx11::string::~string((string *)local_318);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffc88,(string *)prefix);
  std::__cxx11::string::append(&stack0xfffffffffffffc88);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  *(undefined8 *)
   ((long)&local_318[0]._M_string_length + *(long *)(local_318[0]._M_dataplus._M_p + -0x18)) = 0x20;
  std::ostream::operator<<((ostream *)local_318,value->y);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffc88,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc88);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::__cxx11::string::~string((string *)&local_358);
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrOffset2Df* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string x_prefix = prefix;
        x_prefix += "x";
        std::ostringstream oss_x;
        oss_x << std::setprecision(32) << (value->x);
        contents.emplace_back("float", x_prefix, oss_x.str());
        std::string y_prefix = prefix;
        y_prefix += "y";
        std::ostringstream oss_y;
        oss_y << std::setprecision(32) << (value->y);
        contents.emplace_back("float", y_prefix, oss_y.str());
        return true;
    } catch(...) {
    }
    return false;
}